

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
process<pugi::impl::(anonymous_namespace)::utf8_counter>
          (ushort *param_1,ulong param_2,value_type param_3)

{
  ushort uVar1;
  uint16_t next;
  uint16_t lead;
  value_type local_20;
  ulong local_18;
  ushort *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  while (local_18 != 0) {
    uVar1 = *local_10;
    if (uVar1 < 0xd800) {
      local_20 = utf8_counter::low(local_20,(uint)uVar1);
      local_10 = local_10 + 1;
      local_18 = local_18 - 1;
    }
    else if (uVar1 - 0xe000 < 0x2000) {
      local_20 = utf8_counter::low(local_20,(uint)uVar1);
      local_10 = local_10 + 1;
      local_18 = local_18 - 1;
    }
    else if ((uVar1 - 0xd800 < 0x400) && (1 < local_18)) {
      if (local_10[1] - 0xdc00 < 0x400) {
        local_20 = utf8_counter::high(local_20,(uVar1 & 0x3ff) * 0x400 + 0x10000 +
                                               (local_10[1] & 0x3ff));
        local_10 = local_10 + 2;
        local_18 = local_18 - 2;
      }
      else {
        local_10 = local_10 + 1;
        local_18 = local_18 - 1;
      }
    }
    else {
      local_10 = local_10 + 1;
      local_18 = local_18 - 1;
    }
  }
  return local_20;
}

Assistant:

static inline typename Traits::value_type process(const uint16_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint16_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+D7FF
				if (lead < 0xD800)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+E000..U+FFFF
				else if (static_cast<unsigned int>(lead - 0xE000) < 0x2000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// surrogate pair lead
				else if (static_cast<unsigned int>(lead - 0xD800) < 0x400 && size >= 2)
				{
					uint16_t next = opt_swap::value ? endian_swap(data[1]) : data[1];

					if (static_cast<unsigned int>(next - 0xDC00) < 0x400)
					{
						result = Traits::high(result, 0x10000 + ((lead & 0x3ff) << 10) + (next & 0x3ff));
						data += 2;
						size -= 2;
					}
					else
					{
						data += 1;
						size -= 1;
					}
				}
				else
				{
					data += 1;
					size -= 1;
				}
			}

			return result;
		}